

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::RegisterTests
          (ParameterizedTestSuiteInfo<rtripflagProblems> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  pointer pcVar2;
  element_type *peVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
  _Var4;
  _Alloc_hider name;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  long *plVar10;
  int *value;
  ostream *poVar11;
  size_t sVar12;
  const_iterator cVar13;
  long *plVar14;
  char *pcVar15;
  undefined4 extraout_var_01;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_02;
  pointer pIVar16;
  pointer local_1a8;
  string param_name;
  string test_suite_name;
  size_type local_150;
  string local_140;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_name;
  string local_d0;
  ParamGenerator<int> generator;
  CodeLocation local_a0;
  pointer local_78;
  pointer local_70;
  pointer local_68;
  code *local_60;
  CodeLocation local_58;
  long *plVar9;
  undefined4 extraout_var_00;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  local_1a8 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1a8 != local_78) {
    bVar6 = false;
    do {
      pIVar16 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_70 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar16 != local_70) {
        do {
          (*(code *)pIVar16->generator)(&generator);
          local_60 = (code *)pIVar16->name_func;
          __s = pIVar16->file;
          iVar8 = pIVar16->line;
          if ((pIVar16->name)._M_string_length == 0) {
            test_suite_name._M_string_length = 0;
            *test_suite_name._M_dataplus._M_p = '\0';
          }
          else {
            test_param_names._M_t._M_impl._0_8_ =
                 &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar2 = (pIVar16->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&test_param_names,pcVar2,pcVar2 + (pIVar16->name)._M_string_length)
            ;
            std::__cxx11::string::append((char *)&test_param_names);
            std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
            if ((_Base_ptr *)test_param_names._M_t._M_impl._0_8_ !=
                &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)test_param_names._M_t._M_impl._0_8_,
                              (ulong)((long)&(test_param_names._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&test_suite_name,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          iVar7 = (*(generator.impl_.
                     super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
          plVar9 = (long *)CONCAT44(extraout_var,iVar7);
          iVar7 = (*(generator.impl_.
                     super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
          plVar10 = (long *)CONCAT44(extraout_var_00,iVar7);
          local_68 = pIVar16;
          if (plVar9 != plVar10) {
            local_150 = 0;
            do {
              cVar5 = (**(code **)(*plVar9 + 0x30))(plVar9,plVar10);
              if (cVar5 != '\0') break;
              value = (int *)(**(code **)(*plVar9 + 0x28))();
              test_name._M_string_length = 0;
              *test_name._M_dataplus._M_p = '\0';
              local_140._M_dataplus._M_p._0_4_ = *value;
              local_140._M_string_length = local_150;
              (*local_60)(&param_name,&local_140);
              bVar6 = IsValidParamName(&param_name);
              bVar6 = IsTrue(bVar6);
              if (!bVar6) {
                GTestLog::GTestLog((GTestLog *)&local_140,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                     param_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
                }
                else {
                  sVar12 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,__s,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," line ",6);
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_140);
              }
              cVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&test_param_names,&param_name);
              bVar6 = IsTrue((_Rb_tree_header *)cVar13._M_node ==
                             &test_param_names._M_t._M_impl.super__Rb_tree_header);
              if (!bVar6) {
                GTestLog::GTestLog((GTestLog *)&local_140,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                     param_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
                }
                else {
                  sVar12 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,__s,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," line ",6);
                plVar14 = (long *)std::ostream::operator<<((ostream *)poVar11,iVar8);
                std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
                std::ostream::put((char)plVar14);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_140);
              }
              peVar3 = (local_1a8->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar3->test_base_name)._M_string_length != 0) {
                pcVar15 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&test_name,
                                             (ulong)(peVar3->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar15);
              }
              std::__cxx11::string::_M_append((char *)&test_name,(ulong)param_name._M_dataplus._M_p)
              ;
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&test_param_names,&param_name);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,test_suite_name._M_dataplus._M_p,
                         test_suite_name._M_dataplus._M_p + test_suite_name._M_string_length);
              name = test_name._M_dataplus;
              PrintToString<int>(&local_140,value);
              pcVar15 = (char *)CONCAT44(local_140._M_dataplus._M_p._4_4_,
                                         (int)local_140._M_dataplus._M_p);
              peVar3 = (local_1a8->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_a0.file._M_dataplus._M_p = (pointer)&local_a0.file.field_2;
              pcVar2 = (peVar3->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,pcVar2,
                         pcVar2 + (peVar3->code_location).file._M_string_length);
              local_a0.line = (peVar3->code_location).line;
              iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])();
              set_up_tc = SuiteApiResolver<rtripflagProblems>::GetSetUpCaseOrSuite(__s,iVar8);
              tear_down_tc = SuiteApiResolver<rtripflagProblems>::GetTearDownCaseOrSuite(__s,iVar8);
              _Var4.super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>.
              _M_head_impl = (((local_1a8->
                               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->test_meta_factory)._M_t.
                             super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<int>,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
                             .
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
              ;
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)_Var4.
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
                                              ._M_head_impl + 0x10))
                                  (_Var4.
                                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
                                   ._M_head_impl,*value);
              MakeAndRegisterTestInfo
                        (&local_d0,name._M_p,(char *)0x0,pcVar15,&local_a0,
                         (TypeId)CONCAT44(extraout_var_01,iVar7),set_up_tc,tear_down_tc,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0.file._M_dataplus._M_p != &local_a0.file.field_2) {
                operator_delete(local_a0.file._M_dataplus._M_p,
                                local_a0.file.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_140._M_dataplus._M_p._4_4_,(int)local_140._M_dataplus._M_p) !=
                  &local_140.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_140._M_dataplus._M_p._4_4_,
                                         (int)local_140._M_dataplus._M_p),
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)param_name._M_dataplus._M_p != &param_name.field_2) {
                operator_delete(param_name._M_dataplus._M_p,
                                param_name.field_2._M_allocated_capacity + 1);
              }
              (**(code **)(*plVar9 + 0x18))(plVar9);
              local_150 = local_150 + 1;
              bVar6 = true;
            } while (plVar9 != plVar10);
          }
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 8))(plVar10);
          }
          pIVar16 = local_68;
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 8))();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&test_param_names._M_t);
          if (generator.impl_.
              super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pIVar16 = pIVar16 + 1;
        } while (pIVar16 != local_70);
      }
      local_1a8 = local_1a8 + 1;
    } while (local_1a8 != local_78);
    if (bVar6) goto LAB_0014dcb5;
  }
  iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                    (this);
  paVar1 = &local_58.file.field_2;
  pcVar2 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_02,iVar8),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_0014dcb5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name._M_dataplus._M_p != &test_name.field_2) {
    operator_delete(test_name._M_dataplus._M_p,
                    CONCAT71(test_name.field_2._M_allocated_capacity._1_7_,
                             test_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_suite_name._M_dataplus._M_p != &test_suite_name.field_2) {
    operator_delete(test_suite_name._M_dataplus._M_p,
                    CONCAT71(test_suite_name.field_2._M_allocated_capacity._1_7_,
                             test_suite_name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }